

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adf.cpp
# Opt level: O2

bool ReadADF(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t i;
  ssize_t sVar4;
  ulong uVar5;
  Data *data;
  uint uVar6;
  uint uVar7;
  size_t in_RCX;
  char *__stream;
  uint32_t prev;
  Format *new_fmt;
  Format fmtHD;
  Format fmtDD;
  uint8_t bootblock [1024];
  
  Format::Format(&fmtDD,AmigaDOS);
  Format::Format(&fmtHD,AmigaDOSHD);
  iVar2 = MemFile::size(file);
  iVar3 = Format::disk_size(&fmtDD);
  if (iVar2 == iVar3) {
LAB_0017f119:
    uVar7 = 0;
    bVar1 = MemFile::seek(file,0);
    if (!bVar1) goto LAB_0017f17e;
    __stream = (char *)bootblock;
    sVar4 = MemFile::read(file,(int)__stream,(void *)0x400,in_RCX);
    if ((char)sVar4 != '\0') {
      uVar7 = 0;
      if ((bootblock._0_4_ & 0xffffff) == 0x534f44) {
        for (uVar5 = 0; uVar5 < 0x400; uVar5 = uVar5 + 4) {
          uVar6 = *(uint *)(bootblock + uVar5);
          uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          uVar7 = uVar6 + uVar7 + (uint)CARRY4(uVar6,uVar7);
        }
        if (uVar7 != 0xffffffff) {
          __stream = "invalid AmigaDOS root block checksum";
          Message<>(msgWarning,"invalid AmigaDOS root block checksum");
        }
        MemFile::rewind(file,(FILE *)__stream);
        this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar2 = MemFile::size(file);
        iVar3 = Format::disk_size(&fmtDD);
        new_fmt = &fmtHD;
        if (iVar2 == iVar3) {
          new_fmt = &fmtDD;
        }
        data = MemFile::data(file);
        Disk::format(this,new_fmt,data,true);
        std::__cxx11::string::assign
                  ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                            strType);
        uVar7 = 1;
      }
      goto LAB_0017f17e;
    }
  }
  else {
    iVar2 = MemFile::size(file);
    iVar3 = Format::disk_size(&fmtHD);
    if (iVar2 == iVar3) goto LAB_0017f119;
  }
  uVar7 = 0;
LAB_0017f17e:
  return SUB41(uVar7,0);
}

Assistant:

bool ReadADF(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmtDD{ RegularFormat::AmigaDOS };
    Format fmtHD{ RegularFormat::AmigaDOSHD };

    if (file.size() != fmtDD.disk_size() && file.size() != fmtHD.disk_size())
        return false;

    uint8_t bootblock[ADF_BOOTBLOCK_SIZE];
    auto pbb = reinterpret_cast<const ADF_BOOTBLOCK*>(bootblock);

    if (!file.seek(0) || !file.read(&bootblock, sizeof(bootblock)))
        return false;

    // Check for AmigaDOS signature
    if ((util::betoh(pbb->disk_type) & 0xffffff00) != 0x444f5300)
        return false;

    uint32_t checksum = 0;
    for (size_t i = 0; i < sizeof(bootblock); i += sizeof(uint32_t))
    {
        auto prev = checksum;

        checksum += util::betoh(*reinterpret_cast<uint32_t*>(bootblock + i));
        if (checksum < prev)
            checksum++;
    }

    if (~checksum)
        Message(msgWarning, "invalid AmigaDOS root block checksum");;

    file.rewind();
    disk->format(file.size() == fmtDD.disk_size() ? fmtDD : fmtHD, file.data(), true);
    disk->strType = "ADF";

    return true;
}